

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<long> tcb::operator/(rational<long> *lhs,rational<long> *rhs)

{
  rational<long> rVar1;
  rational<long> local_18;
  
  local_18.num_ = rhs->denom_ * lhs->num_;
  local_18.denom_ = rhs->num_ * lhs->denom_;
  rational<long>::simplify(&local_18);
  rVar1.denom_ = local_18.denom_;
  rVar1.num_ = local_18.num_;
  return rVar1;
}

Assistant:

constexpr value_type denom() const { return denom_; }